

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool __thiscall
tinyobj::MaterialStreamReader::operator()
          (MaterialStreamReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  uint uVar1;
  istream *inStream;
  ostream *poVar2;
  string warning;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [23];
  
  inStream = this->m_inStream;
  uVar1 = *(uint *)(inStream + *(long *)(*(long *)inStream + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    local_198._0_8_ = local_198 + 0x10;
    local_198._8_8_ = 0;
    local_188[0]._M_local_buf[0] = '\0';
    LoadMtl(matMap,materials,inStream,(string *)local_198);
    if ((err != (string *)0x0) && (local_198._8_8_ != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
      ;
    }
    std::__cxx11::string::~string((string *)local_198);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_198);
    poVar2 = std::operator<<((ostream *)(local_198 + 0x10),"WARN: Material stream in error state. ")
    ;
    std::endl<char,std::char_traits<char>>(poVar2);
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (err,&bStack_1b8);
      std::__cxx11::string::~string((string *)&bStack_1b8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool MaterialStreamReader::operator()(const std::string &matId,
                                      std::vector<material_t> *materials,
                                      std::map<std::string, int> *matMap,
                                      std::string *err) {
  (void)matId;
  if (!m_inStream) {
    std::stringstream ss;
    ss << "WARN: Material stream in error state. " << std::endl;
    if (err) {
      (*err) += ss.str();
    }
    return false;
  }

  std::string warning;
  LoadMtl(matMap, materials, &m_inStream, &warning);

  if (!warning.empty()) {
    if (err) {
      (*err) += warning;
    }
  }

  return true;
}